

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d960c9::Joystick::did_set_input
          (Joystick *this,Input *digital_input,bool is_active)

{
  switch(digital_input->type) {
  case Up:
    break;
  case Down:
    if (!is_active) {
      this->kempston_ = this->kempston_ & 0xfb;
      this->sinclair_ = this->sinclair_ | 0x404;
      return;
    }
    this->kempston_ = this->kempston_ | 4;
    this->sinclair_ = this->sinclair_ & 0xfbfb;
    return;
  case Left:
    if (!is_active) {
      this->kempston_ = this->kempston_ & 0xfd;
      this->sinclair_ = this->sinclair_ | 0x110;
      return;
    }
    this->kempston_ = this->kempston_ | 2;
    this->sinclair_ = this->sinclair_ & 0xfeef;
    return;
  case Right:
    if (!is_active) {
      this->kempston_ = this->kempston_ & 0xfe;
      this->sinclair_ = this->sinclair_ | 0x208;
      return;
    }
    this->kempston_ = this->kempston_ | 1;
    this->sinclair_ = this->sinclair_ & 0xfdf7;
    return;
  default:
    return;
  case Fire:
    if (!is_active) {
      this->kempston_ = this->kempston_ & 0xef;
      this->sinclair_ = this->sinclair_ | 0x1001;
      return;
    }
    this->kempston_ = this->kempston_ | 0x10;
    this->sinclair_ = this->sinclair_ & 0xeffe;
    return;
  }
  if (!is_active) {
    this->kempston_ = this->kempston_ & 0xf7;
    this->sinclair_ = this->sinclair_ | 0x802;
    return;
  }
  this->kempston_ = this->kempston_ | 8;
  this->sinclair_ = this->sinclair_ & 0xf7fd;
  return;
}

Assistant:

void did_set_input(const Input &digital_input, bool is_active) final {
#define APPLY(b)	if(is_active) state_ &= ~b; else state_ |= b;
			switch(digital_input.type) {
				default: return;
				case Input::Right:	APPLY(0x02);	break;
				case Input::Left:	APPLY(0x01);	break;
				case Input::Down:	APPLY(0x08);	break;
				case Input::Up:		APPLY(0x10);	break;
				case Input::Fire:	APPLY(0x20);	break;
			}
#undef APPLY
		}